

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O1

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignaturePruning::
iteration(wasm::Module*)::Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::
function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::
Module*)::Info&)>)::Mapper::doWalkFunction(wasm::Function__(void *this,Function *curr)

{
  _Rb_tree_header *p_Var1;
  map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
  *this_00;
  mapped_type_conflict *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  Function *local_28;
  Function *local_20;
  Function *curr_local;
  
  this_00 = *(map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
              **)((long)this + 0x138);
  p_Var1 = &(this_00->_M_t)._M_impl.super__Rb_tree_header;
  p_Var4 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(Function **)(p_Var4 + 1) < curr]) {
    if (*(Function **)(p_Var4 + 1) >= curr) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, curr < *(Function **)(p_Var3 + 1)))
  {
    p_Var4 = &p_Var1->_M_header;
  }
  local_20 = curr;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    pmVar2 = std::
             map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
             ::operator[](this_00,&local_20);
    local_28 = curr;
    if (*(long *)((long)this + 0x150) != 0) {
      (**(code **)((long)this + 0x158))((long)this + 0x140,&local_28,pmVar2);
      return;
    }
    std::__throw_bad_function_call();
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x13e,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<Info>::doAnalysis(Func)::Mapper::doWalkFunction(Function *) [T = Info, Mut = wasm::Immutable, MapT = wasm::ModuleUtils::DefaultMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }